

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void Assimp::COBImporter::ThrowException(string *msg)

{
  DeadlyImportError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  string *msg_local;
  
  local_10 = msg;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_30,"COB: ",local_10);
  DeadlyImportError::DeadlyImportError(this,&local_30);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

AI_WONT_RETURN void COBImporter::ThrowException(const std::string& msg)
{
    throw DeadlyImportError("COB: "+msg);
}